

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O2

void highbd_clamp_epi32_avx2(__m256i *in,__m256i *out,__m256i *clamp_lo,__m256i *clamp_hi,int size)

{
  undefined1 auVar1 [32];
  long lVar2;
  long lVar3;
  
  lVar2 = 0x60;
  for (lVar3 = 0; lVar3 < size; lVar3 = lVar3 + 4) {
    auVar1 = vpmaxsd_avx2(*(undefined1 (*) [32])((long)in[-3] + lVar2),(undefined1  [32])*clamp_lo);
    auVar1 = vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
    *(undefined1 (*) [32])((long)out[-3] + lVar2) = auVar1;
    auVar1 = vpmaxsd_avx2(*(undefined1 (*) [32])((long)in[-2] + lVar2),(undefined1  [32])*clamp_lo);
    auVar1 = vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
    *(undefined1 (*) [32])((long)out[-2] + lVar2) = auVar1;
    auVar1 = vpmaxsd_avx2(*(undefined1 (*) [32])((long)in[-1] + lVar2),(undefined1  [32])*clamp_lo);
    auVar1 = vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
    *(undefined1 (*) [32])((long)out[-1] + lVar2) = auVar1;
    auVar1 = vpmaxsd_avx2(*(undefined1 (*) [32])((long)*in + lVar2),(undefined1  [32])*clamp_lo);
    auVar1 = vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
    *(undefined1 (*) [32])((long)*out + lVar2) = auVar1;
    lVar2 = lVar2 + 0x80;
  }
  return;
}

Assistant:

static void highbd_clamp_epi32_avx2(__m256i *in, __m256i *out,
                                    const __m256i *clamp_lo,
                                    const __m256i *clamp_hi, int size) {
  __m256i a0, a1;
  for (int i = 0; i < size; i += 4) {
    a0 = _mm256_max_epi32(in[i], *clamp_lo);
    out[i] = _mm256_min_epi32(a0, *clamp_hi);

    a1 = _mm256_max_epi32(in[i + 1], *clamp_lo);
    out[i + 1] = _mm256_min_epi32(a1, *clamp_hi);

    a0 = _mm256_max_epi32(in[i + 2], *clamp_lo);
    out[i + 2] = _mm256_min_epi32(a0, *clamp_hi);

    a1 = _mm256_max_epi32(in[i + 3], *clamp_lo);
    out[i + 3] = _mm256_min_epi32(a1, *clamp_hi);
  }
}